

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool P_HitWater(AActor *thing,sector_t *sec,DVector3 *pos,bool checkabove,bool alert,bool force)

{
  int iVar1;
  F3DFloor *pFVar2;
  double dVar3;
  FSplashDef *pFVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  sector_t_conflict *psVar8;
  AActor *ent;
  ulong uVar9;
  sector_t_conflict *this;
  sector_t *psVar10;
  long lVar11;
  bool bVar12;
  FSoundID local_50;
  FSoundID local_4c;
  DVector2 local_48;
  
  if (((thing->flags3).Value & 0x40) != 0) {
    return false;
  }
  if ((thing->player == (player_t *)0x0) || ((thing->player->cheats & 0x2000) == 0)) {
    if (checkabove) {
      dVar3 = thing->Height * 0.5 + (thing->__Pos).Z;
      if (((thing->flags).Value & 0x10000) != 0) {
        dVar3 = dVar3 - (thing->Vel).Z;
      }
      if (dVar3 < pos->Z) goto LAB_0042c8ce;
    }
    if (!force) {
      for (uVar9 = 0; uVar9 < (sec->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
          uVar9 = uVar9 + 1) {
        pFVar2 = (sec->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar9];
        if ((pFVar2->flags & 1) != 0) {
          local_48.X = pos->X;
          local_48.Y = pos->Y;
          dVar3 = secplane_t::ZatPoint((pFVar2->top).plane,&local_48);
          if (((dVar3 + -0.5 < pos->Z) && (pos->Z < dVar3 + 0.5)) && ((pFVar2->flags & 0x12) != 0))
          {
            iVar6 = sector_t::GetTerrain(pFVar2->model,(pFVar2->top).isceiling);
            bVar12 = true;
            goto LAB_0042c654;
          }
          local_48.X = pos->X;
          local_48.Y = pos->Y;
          dVar3 = secplane_t::ZatPoint((pFVar2->bottom).plane,&local_48);
          if ((dVar3 < pos->Z) && (thing->floorz <= dVar3)) goto LAB_0042c8ce;
        }
      }
    }
    psVar8 = sector_t::GetHeightSec((sector_t_conflict *)sec);
    bVar12 = psVar8 == (sector_t_conflict *)0x0;
    this = (sector_t_conflict *)sec;
    if ((!bVar12 && !force) && ((psVar8->MoreFlags & 4) != 0)) {
      bVar12 = false;
      this = psVar8;
    }
    iVar6 = sector_t::GetTerrain((sector_t *)this,0);
LAB_0042c654:
    pFVar4 = Splashes.Array;
    lVar11 = (long)Terrains.Array[iVar6].Splash;
    if ((lVar11 != -1) && ((thing->waterlevel < 1 || (thing->floorz < pos->Z)))) {
      psVar10 = sec;
      if (!bVar12) {
        psVar10 = sec->heightsec;
      }
      if (((((thing->flags3).Value & 0x2000) == 0) && (thing->player == (player_t *)0x0)) ||
         ((thing->Vel).Z < -6.0 || force)) {
        iVar1 = thing->Mass;
        if ((iVar1 < 10) && (Splashes.Array[lVar11].SmallSplash != (PClassActor *)0x0)) {
          ent = Spawn(Splashes.Array[lVar11].SmallSplash,pos,ALLOW_REPLACE);
          if (ent == (AActor *)0x0) goto LAB_0042c88c;
          ent->Floorclip = pFVar4[lVar11].SmallSplashClip + ent->Floorclip;
LAB_0042c85b:
          local_4c.ID = (&pFVar4[lVar11].SmallSplashSound)[9 < iVar1].ID;
          S_Sound(ent,3,&local_4c,1.0,1.001);
        }
        else {
          if (Splashes.Array[lVar11].SplashChunk == (PClassActor *)0x0) {
            ent = (AActor *)0x0;
          }
          else {
            ent = Spawn(Splashes.Array[lVar11].SplashChunk,pos,ALLOW_REPLACE);
            (ent->target).field_0.p = thing;
            if (pFVar4[lVar11].ChunkXVelShift != 0xff) {
              iVar7 = FRandom::Random2(&pr_chunk);
              (ent->Vel).X = (double)(iVar7 << (pFVar4[lVar11].ChunkXVelShift & 0x1f)) *
                             1.52587890625e-05;
            }
            if (pFVar4[lVar11].ChunkYVelShift != 0xff) {
              iVar7 = FRandom::Random2(&pr_chunk);
              (ent->Vel).Y = (double)(iVar7 << (pFVar4[lVar11].ChunkYVelShift & 0x1f)) *
                             1.52587890625e-05;
            }
            dVar3 = pFVar4[lVar11].ChunkBaseZVel;
            iVar7 = FRandom::operator()(&pr_chunk);
            (ent->Vel).Z = (double)(iVar7 << (pFVar4[lVar11].ChunkZVelShift & 0x1f)) *
                           1.52587890625e-05 + dVar3;
          }
          if (pFVar4[lVar11].SplashBase != (PClassActor *)0x0) {
            ent = Spawn(pFVar4[lVar11].SplashBase,pos,ALLOW_REPLACE);
          }
          if (((thing->player != (player_t *)0x0) && (alert)) && (pFVar4[lVar11].NoAlert == false))
          {
            P_NoiseAlert(thing,thing,true,0.0);
          }
          if (ent != (AActor *)0x0) goto LAB_0042c85b;
LAB_0042c88c:
          local_50.ID = (&pFVar4[lVar11].SmallSplashSound)[9 < iVar1].ID;
          S_Sound(pos,3,&local_50,1.0,1.001);
        }
        if (psVar10 != sec) goto LAB_0042c8ce;
      }
    }
    uVar5 = Terrains.Array[iVar6].IsLiquid;
  }
  else {
LAB_0042c8ce:
    uVar5 = 0;
  }
  return (bool)uVar5;
}

Assistant:

bool P_HitWater (AActor * thing, sector_t * sec, const DVector3 &pos, bool checkabove, bool alert, bool force)
{
	if (thing->flags3 & MF3_DONTSPLASH)
		return false;

	if (thing->player && (thing->player->cheats & CF_PREDICTING))
		return false;

	AActor *mo = NULL;
	FSplashDef *splash;
	int terrainnum;
	sector_t *hsec = NULL;
	
	// don't splash above the object
	if (checkabove)
	{
		double compare_z = thing->Center();
		// Missiles are typically small and fast, so they might
		// end up submerged by the move that calls P_HitWater.
		if (thing->flags & MF_MISSILE)
			compare_z -= thing->Vel.Z;
		if (pos.Z > compare_z) 
			return false;
	}

#if 0 // needs some rethinking before activation

	// This avoids spawning splashes on invisible self referencing sectors.
	// For network consistency do this only in single player though because
	// it is not guaranteed that all players have GL nodes loaded.
	if (!multiplayer && thing->subsector->sector != thing->subsector->render_sector)
	{
		double zs = thing->subsector->sector->floorplane.ZatPoint(pos);
		double zr = thing->subsector->render_sector->floorplane.ZatPoint(pos);

		if (zs > zr && thing->Z() >= zs) return false;
	}
#endif

	// 'force' means, we want this sector's terrain, no matter what.
	if (!force)
	{
		for (unsigned int i = 0; i<sec->e->XFloor.ffloors.Size(); i++)
		{
			F3DFloor * rover = sec->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;
			double planez = rover->top.plane->ZatPoint(pos);
				if (pos.Z > planez - 0.5 && pos.Z < planez + 0.5)	// allow minor imprecisions
			{
				if (rover->flags & (FF_SOLID | FF_SWIMMABLE))
				{
					terrainnum = rover->model->GetTerrain(rover->top.isceiling);
					goto foundone;
				}
			}
			planez = rover->bottom.plane->ZatPoint(pos);
			if (planez < pos.Z && !(planez < thing->floorz)) return false;
		}
	}
	hsec = sec->GetHeightSec();
	if (force || hsec == NULL || !(hsec->MoreFlags & SECF_CLIPFAKEPLANES))
	{
		terrainnum = sec->GetTerrain(sector_t::floor);
	}
	else
	{
		terrainnum = hsec->GetTerrain(sector_t::floor);
	}
foundone:

	int splashnum = Terrains[terrainnum].Splash;
	bool smallsplash = false;
	const secplane_t *plane;

	if (splashnum == -1)
		return Terrains[terrainnum].IsLiquid;

	// don't splash when touching an underwater floor
	if (thing->waterlevel >= 1 && pos.Z <= thing->floorz) return Terrains[terrainnum].IsLiquid;

	plane = hsec != NULL? &sec->heightsec->floorplane : &sec->floorplane;

	// Don't splash for living things with small vertical velocities.
	// There are levels where the constant splashing from the monsters gets extremely annoying
	if (((thing->flags3&MF3_ISMONSTER || thing->player) && thing->Vel.Z >= -6) && !force)
		return Terrains[terrainnum].IsLiquid;

	splash = &Splashes[splashnum];

	// Small splash for small masses
	if (thing->Mass < 10)
		smallsplash = true;

	if (smallsplash && splash->SmallSplash)
	{
		mo = Spawn (splash->SmallSplash, pos, ALLOW_REPLACE);
		if (mo) mo->Floorclip += splash->SmallSplashClip;
	}
	else
	{
		if (splash->SplashChunk)
		{
			mo = Spawn (splash->SplashChunk, pos, ALLOW_REPLACE);
			mo->target = thing;
			if (splash->ChunkXVelShift != 255)
			{
				mo->Vel.X = (pr_chunk.Random2() << splash->ChunkXVelShift) / 65536.;
			}
			if (splash->ChunkYVelShift != 255)
			{
				mo->Vel.Y = (pr_chunk.Random2() << splash->ChunkYVelShift) / 65536.;
			}
			mo->Vel.Z = splash->ChunkBaseZVel + (pr_chunk() << splash->ChunkZVelShift) / 65536.;
		}
		if (splash->SplashBase)
		{
			mo = Spawn (splash->SplashBase, pos, ALLOW_REPLACE);
		}
		if (thing->player && !splash->NoAlert && alert)
		{
			P_NoiseAlert (thing, thing, true);
		}
	}
	if (mo)
	{
		S_Sound (mo, CHAN_ITEM, smallsplash ?
			splash->SmallSplashSound : splash->NormalSplashSound,
			1, ATTN_IDLE);
	}
	else
	{
		S_Sound (pos, CHAN_ITEM, smallsplash ?
			splash->SmallSplashSound : splash->NormalSplashSound,
			1, ATTN_IDLE);
	}

	// Don't let deep water eat missiles
	return plane == &sec->floorplane ? Terrains[terrainnum].IsLiquid : false;
}